

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O2

void __thiscall sglr::GLContext::genBuffers(GLContext *this,int numBuffers,deUint32 *buffers)

{
  glu::CallLogWrapper::glGenBuffers(this->m_wrapper,numBuffers,buffers);
  if (0 < numBuffers) {
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_range_unique<unsigned_int*>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&this->m_allocatedBuffers,buffers,buffers + (uint)numBuffers);
    return;
  }
  return;
}

Assistant:

void GLContext::genBuffers (int numBuffers, deUint32* buffers)
{
	m_wrapper->glGenBuffers(numBuffers, buffers);
	if (numBuffers > 0)
		m_allocatedBuffers.insert(buffers, buffers+numBuffers);
}